

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void state_TEXM3X3PAD(Context *ctx)

{
  int *piVar1;
  long lVar2;
  uint uVar3;
  
  uVar3 = 0;
  if (ctx->minor_ver != 0xff) {
    uVar3 = (uint)ctx->minor_ver;
  }
  if (0x10003 < (uVar3 | (uint)ctx->major_ver << 0x10)) {
    failf(ctx,"%s","TEXM3X2TEX opcode not available after Shader Model 1.3");
  }
  state_texops(ctx,"TEXM3X3PAD",0,0);
  if (ctx->texm3x3pad_dst0 == -1) {
    piVar1 = &ctx->texm3x3pad_dst0;
    lVar2 = 0x538;
  }
  else {
    if (ctx->texm3x3pad_dst1 != -1) {
      return;
    }
    piVar1 = &ctx->texm3x3pad_dst1;
    lVar2 = 0x540;
  }
  *(int *)((long)&ctx->isfail + lVar2) = ctx->source_args[0].regnum;
  *piVar1 = (ctx->dest_arg).regnum;
  return;
}

Assistant:

static void state_TEXM3X3PAD(Context *ctx)
{
    if (shader_version_atleast(ctx, 1, 4))
        fail(ctx, "TEXM3X2TEX opcode not available after Shader Model 1.3");
    state_texops(ctx, "TEXM3X3PAD", 0, 0);

    // !!! FIXME: check for correct opcode existance and order more rigorously?
    if (ctx->texm3x3pad_dst0 == -1)
    {
        ctx->texm3x3pad_src0 = ctx->source_args[0].regnum;
        ctx->texm3x3pad_dst0 = ctx->dest_arg.regnum;
    } // if
    else if (ctx->texm3x3pad_dst1 == -1)
    {
        ctx->texm3x3pad_src1 = ctx->source_args[0].regnum;
        ctx->texm3x3pad_dst1 = ctx->dest_arg.regnum;
    } // else
}